

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O3

void testParse(char *cmdLine,char **refArgs,int numArgs)

{
  deBool dVar1;
  deCommandLine *ptr;
  ulong uVar2;
  
  ptr = deCommandLine_parse(cmdLine);
  if (ptr == (deCommandLine *)0x0) {
    deAssertFail("parsedCmdLine",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                 ,0x97);
  }
  if (ptr->numArgs != numArgs) {
    deAssertFail("parsedCmdLine->numArgs == numArgs",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                 ,0x98);
  }
  if (0 < numArgs) {
    uVar2 = 0;
    do {
      dVar1 = deStringEqual(ptr->args[uVar2],refArgs[uVar2]);
      if (dVar1 == 0) {
        deAssertFail("deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/deutil/deCommandLine.c"
                     ,0x9b);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)numArgs != uVar2);
  }
  deFree(ptr->argBuf);
  deFree(ptr);
  return;
}

Assistant:

static void testParse (const char* cmdLine, const char* const* refArgs, int numArgs)
{
	deCommandLine*	parsedCmdLine	= deCommandLine_parse(cmdLine);
	int				argNdx;

	DE_TEST_ASSERT(parsedCmdLine);
	DE_TEST_ASSERT(parsedCmdLine->numArgs == numArgs);

	for (argNdx = 0; argNdx < numArgs; argNdx++)
		DE_TEST_ASSERT(deStringEqual(parsedCmdLine->args[argNdx], refArgs[argNdx]));

	deCommandLine_destroy(parsedCmdLine);
}